

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_proxy.hpp
# Opt level: O0

const_iterator * __thiscall
boost::numeric::ublas::
matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
::find(matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
       *this,size_type j)

{
  self_type *in_RSI;
  const_iterator *in_RDI;
  const_subiterator_type it2;
  const_iterator *it;
  const_iterator *this_00;
  matrix_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffc8;
  const_iterator local_28;
  
  this_00 = &local_28;
  it = in_RDI;
  matrix_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::find2(in_stack_ffffffffffffffc8,(int)((ulong)this_00 >> 0x20),(size_type)in_RSI,
          (size_type)in_RDI);
  const_iterator::const_iterator(this_00,in_RSI,(const_subiterator_type *)it);
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator2::~const_iterator2((const_iterator2 *)0x9191f6);
  return in_RDI;
}

Assistant:

BOOST_UBLAS_INLINE
        const_iterator find (size_type j) const {
            const_subiterator_type it2 (data_.find2 (1, i_, j));
#ifdef BOOST_UBLAS_USE_INDEXED_ITERATOR
            return const_iterator (*this, it2.index2 ());
#else
            return const_iterator (*this, it2);
#endif
        }